

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void absl::flags_internal::anon_unknown_0::ResetGeneratorFlags
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *flagfile_value)

{
  bool bVar1;
  Flag<std::vector<std::__cxx11::basic_string<char>_>_> *extraout_RDX;
  Flag<std::vector<std::__cxx11::basic_string<char>_>_> *extraout_RDX_00;
  Flag<std::vector<std::__cxx11::basic_string<char>_>_> *extraout_RDX_01;
  Flag<std::vector<std::__cxx11::basic_string<char>_>_> *extraout_RDX_02;
  Flag<std::vector<std::__cxx11::basic_string<char>_>_> *pFVar2;
  MutexLock local_80;
  MutexLock l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  MutexLock local_18;
  MutexLock l_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagfile_value_local;
  
  l_1.mu_ = (Mutex *)flagfile_value;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(flagfile_value);
  pFVar2 = extraout_RDX;
  if (!bVar1) {
    SetFlag<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&FLAGS_flagfile_abi_cxx11_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)l_1.mu_);
    MutexLock::MutexLock(&local_18,(Mutex *)&(anonymous_namespace)::processing_checks_guard);
    (anonymous_namespace)::flagfile_needs_processing = 0;
    MutexLock::~MutexLock(&local_18);
    pFVar2 = extraout_RDX_00;
  }
  GetFlag<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_30,(absl *)&FLAGS_fromenv_abi_cxx11_,pFVar2);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  pFVar2 = extraout_RDX_01;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    memset(&local_48,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48);
    SetFlag<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&FLAGS_fromenv_abi_cxx11_,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pFVar2 = extraout_RDX_02;
  }
  GetFlag<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_60,(absl *)&FLAGS_tryfromenv_abi_cxx11_,pFVar2);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    memset(&l,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&l);
    SetFlag<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&FLAGS_tryfromenv_abi_cxx11_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&l);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&l);
  }
  MutexLock::MutexLock(&local_80,(Mutex *)&(anonymous_namespace)::processing_checks_guard);
  (anonymous_namespace)::fromenv_needs_processing = 0;
  (anonymous_namespace)::tryfromenv_needs_processing = 0;
  MutexLock::~MutexLock(&local_80);
  return;
}

Assistant:

void ResetGeneratorFlags(const std::vector<std::string>& flagfile_value) {
  // Setting flagfile to the value which collates all the values set on a
  // command line and programmatically. So if command line looked like
  // --flagfile=f1 --flagfile=f2 the final value of the FLAGS_flagfile flag is
  // going to be {"f1", "f2"}
  if (!flagfile_value.empty()) {
    absl::SetFlag(&FLAGS_flagfile, flagfile_value);
    absl::MutexLock l(&flags_internal::processing_checks_guard);
    flags_internal::flagfile_needs_processing = false;
  }

  // fromenv/tryfromenv are set to <undefined> value.
  if (!absl::GetFlag(FLAGS_fromenv).empty()) {
    absl::SetFlag(&FLAGS_fromenv, {});
  }
  if (!absl::GetFlag(FLAGS_tryfromenv).empty()) {
    absl::SetFlag(&FLAGS_tryfromenv, {});
  }

  absl::MutexLock l(&flags_internal::processing_checks_guard);
  flags_internal::fromenv_needs_processing = false;
  flags_internal::tryfromenv_needs_processing = false;
}